

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

int rtr_mgr_start_sockets(rtr_mgr_group *group)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint local_24;
  uint i;
  rtr_mgr_group *group_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  do {
    if (group->sockets_len <= local_24) {
      group->status = RTR_MGR_CONNECTING;
      group_local._4_4_ = 0;
LAB_0010631a:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return group_local._4_4_;
      }
      __stack_chk_fail();
    }
    iVar2 = rtr_start(group->sockets[local_24]);
    if (iVar2 != 0) {
      lrtr_dbg("RTR_MGR: rtr_mgr: Error starting rtr_socket pthread");
      group_local._4_4_ = -1;
      goto LAB_0010631a;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static int rtr_mgr_start_sockets(struct rtr_mgr_group *group)
{
	for (unsigned int i = 0; i < group->sockets_len; i++) {
		if (rtr_start(group->sockets[i]) != 0) {
			MGR_DBG1("rtr_mgr: Error starting rtr_socket pthread");
			return RTR_ERROR;
		}
	}
	group->status = RTR_MGR_CONNECTING;
	return RTR_SUCCESS;
}